

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

JavascriptString *
Js::RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString *flags,ScriptContext *scriptContext)

{
  charcount_t cVar1;
  char16 *pcVar2;
  char16_t *pcVar3;
  TempArenaAllocatorObject *tempAllocator;
  undefined1 local_68 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  
  pcVar2 = JavascriptString::GetString(flags);
  pcVar3 = PAL_wcsstr(pcVar2,L"y");
  if (pcVar3 == (char16_t *)0x0) {
    tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
    cVar1 = JavascriptString::GetLength(flags);
    bs.count = cVar1 + 1;
    bs.alloc = (ArenaAllocator *)0x0;
    bs.firstChunk = (Data *)0x0;
    bs.lastChunk = (Data *)0x0;
    bs.appendPtr = (char16 *)0x0;
    local_68 = (undefined1  [8])&tempAllocator->allocator;
    if (0x7ffffffe < bs.count) {
      Throw::OutOfMemory();
    }
    cVar1 = JavascriptString::GetLength(flags);
    StringBuilder<Memory::ArenaAllocator>::EnsureBuffer
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,cVar1);
    JavascriptString::CopyHelper((char16 *)bs.lastChunk,pcVar2,cVar1);
    bs.lastChunk = (Data *)((long)&(bs.lastChunk)->u + (ulong)cVar1 * 2);
    bs.appendPtr = (char16 *)CONCAT44(bs.appendPtr._4_4_ + cVar1,bs.appendPtr._0_4_);
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'y');
    pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach
                       ((StringBuilder<Memory::ArenaAllocator> *)local_68);
    flags = JavascriptString::NewCopyBuffer(pcVar2,bs.appendPtr._4_4_,scriptContext);
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
  }
  return flags;
}

Assistant:

JavascriptString* RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString* flags, ScriptContext* scriptContext)
    {
        const char16* flagsString = flags->GetString();
        if (wcsstr(flagsString, _u("y")) == nullptr)
        {
            BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("RegexHelper"))
            {
                StringBuilder<ArenaAllocator> bs(tempAlloc, flags->GetLength() + 1);
                bs.Append(flagsString, flags->GetLength());
                bs.Append(_u('y'));
                flags = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
            }
            END_TEMP_ALLOCATOR(tempAlloc, scriptContext);
        }

        return flags;
    }